

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O3

parser_error parse_mon_spell_lore_color_resist(parser *p)

{
  long *plVar1;
  int iVar2;
  parser_error pVar3;
  void *pvVar4;
  char *__s;
  size_t sVar5;
  long *plVar6;
  
  pvVar4 = parser_priv(p);
  if (pvVar4 == (void *)0x0) {
    pVar3 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    __s = parser_getsym(p,"color");
    sVar5 = strlen(__s);
    if (sVar5 < 2) {
      iVar2 = color_char_to_attr(*__s);
    }
    else {
      iVar2 = color_text_to_attr(__s);
    }
    if (iVar2 < 0) {
      pVar3 = PARSE_ERROR_INVALID_COLOR;
    }
    else {
      plVar1 = *(long **)((long)pvVar4 + 0x20);
      do {
        plVar6 = plVar1;
        plVar1 = (long *)*plVar6;
      } while (plVar1 != (long *)0x0);
      *(char *)((long)plVar6 + 0x19) = (char)iVar2;
      pVar3 = PARSE_ERROR_NONE;
    }
  }
  return pVar3;
}

Assistant:

static enum parser_error parse_mon_spell_lore_color_resist(struct parser *p) {
	struct monster_spell *s = parser_priv(p);
	struct monster_spell_level *l;
	const char *color;
	int attr;

	if (!s) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}

	color = parser_getsym(p, "color");
	if (strlen(color) > 1) {
		attr = color_text_to_attr(color);
	} else {
		attr = color_char_to_attr(color[0]);
	}
	if (attr < 0) {
		return PARSE_ERROR_INVALID_COLOR;
	}
	l = s->level;
	while (l->next) {
		l = l->next;
	}
	l->lore_attr_resist = attr;
	return PARSE_ERROR_NONE;
}